

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_plp_clears_b_and_sets_bit_5_Test::TestBody
          (CpuTest_plp_clears_b_and_sets_bit_5_Test *this)

{
  bool bVar1;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_00;
  char *message;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_b8;
  WithoutMatchers local_91;
  Matcher<unsigned_short> local_90;
  MockSpec<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_plp_clears_b_and_sets_bit_5_Test *local_10;
  CpuTest_plp_clears_b_and_sets_bit_5_Test *this_local;
  
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'(');
  (this->super_CpuTest).registers.sp = '\n';
  (this->super_CpuTest).registers.p = 0xbb;
  (this->super_CpuTest).expected.sp = (this->super_CpuTest).registers.sp + '\x01';
  (this->super_CpuTest).expected.p = 0xa1;
  testing::Matcher<unsigned_short>::Matcher(&local_48,(this->super_CpuTest).expected.pc);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_30,local_55,(void *)0x0);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
             ,0xc1,"mmu","read_byte(expected.pc)");
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  testing::Matcher<unsigned_short>::Matcher(&local_90,(this->super_CpuTest).expected.sp | 0x100);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_78,&(this->super_CpuTest).mmu.super_MockMmu,&local_90);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_78,&local_91,(void *)0x0);
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      (pMVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                       ,0xc2,"mmu","read_byte(kStackOffset + expected.sp)");
  testing::Return<int>((testing *)&gtest_ar.message_,0x91);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_b8,(ReturnAction *)&gtest_ar.message_);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(this_00,&local_b8);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_b8);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_78);
  testing::Matcher<unsigned_short>::~Matcher(&local_90);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x04');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_d8,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0xc6,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  return;
}

Assistant:

TEST_F(CpuTest, plp_clears_b_and_sets_bit_5) {
    stage_instruction(PLP);
    registers.sp = 0x0A;
    registers.p = 0xBB;

    expected.sp = registers.sp + static_cast<uint8_t>(1u);
    expected.p = static_cast<uint8_t>(FLAG_5 | C_FLAG) | N_FLAG;

    // Dummy read
    EXPECT_CALL(mmu, read_byte(expected.pc));
    EXPECT_CALL(mmu, read_byte(kStackOffset + expected.sp))
            .WillOnce(Return(static_cast<uint8_t>(B_FLAG | C_FLAG) | N_FLAG));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}